

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O2

err_t cmdPwdGen(cmd_pwd_t *pwd,char *cmdline)

{
  octet *salt;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  u32 uVar4;
  size_t sVar5;
  size_t sVar6;
  octet *poVar7;
  cmd_pwd_t dest;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  octet *pwd_00;
  long lVar11;
  octet *si;
  int argc;
  undefined8 local_88;
  char **argv;
  size_t local_78;
  ulong local_70;
  size_t local_68;
  octet *local_60;
  octet *local_58;
  char **local_50;
  size_t local_48;
  long local_40;
  octet *local_38;
  
  bVar1 = strStartsWith(cmdline,"pass:");
  if (bVar1 == 0) {
    bVar1 = strStartsWith(cmdline,"env:");
    if (bVar1 == 0) {
      bVar1 = strStartsWith(cmdline,"share:");
      if (bVar1 == 0) {
        return 0x25b;
      }
      sVar5 = strLen("share:");
      argv = (char **)0x0;
      local_60 = (octet *)0x0;
      eVar2 = cmdArgCreate(&argc,&argv,cmdline + sVar5);
      if (eVar2 != 0) {
        return eVar2;
      }
      lVar9 = 0;
      local_70 = 0;
      local_78 = 0;
      local_88 = (ulong)local_88._4_4_ << 0x20;
LAB_00104e37:
      lVar11 = lVar9 * 8;
      lVar9 = lVar9 + 1;
      do {
        if ((argc == 0) || (bVar1 = strStartsWith(*(char **)((long)argv + lVar11),"-"), bVar1 == 0))
        {
          pwd_00 = local_60;
          eVar2 = 0x25b;
          if (local_60 == (octet *)0x0) {
            pwd_00 = (octet *)0x0;
            goto LAB_00105143;
          }
          uVar10 = 2;
          if (local_70 != 0) {
            uVar10 = local_70;
          }
          if (((ulong)(long)argc < uVar10) ||
             (eVar2 = cmdFileValNotExist(argc,(char **)((long)argv + lVar11)), eVar2 != 0))
          goto LAB_00105143;
          local_70 = (ulong)argc;
          local_50 = argv;
          *pwd = (cmd_pwd_t)0x0;
          sVar5 = 0x20;
          if (local_78 != 0) {
            sVar5 = local_78;
          }
          local_78 = sVar5 + 1;
          eVar2 = bpkiShareWrap((octet *)0x0,&local_48,(octet *)0x0,local_78,(octet *)0x0,0,
                                (octet *)0x0,10000);
          if ((eVar2 != 0) || (local_68 = sVar5, eVar2 = cmdRngStart(1), eVar2 != 0))
          goto LAB_00105143;
          sVar5 = beltMAC_keep();
          lVar9 = local_78 * local_70;
          sVar6 = utilMax(2,sVar5,lVar9 + local_48 + 8);
          sVar5 = local_68;
          poVar7 = (octet *)blobCreate(sVar6 + local_68);
          if (poVar7 == (octet *)0x0) {
            eVar2 = 0x6e;
            goto LAB_00105143;
          }
          si = poVar7 + sVar5;
          local_40 = lVar9;
          if ((int)local_88 == 0) {
            rngStepR(poVar7,sVar5,(void *)0x0);
          }
          else {
            local_88 = sVar5 - 8;
            rngStepR(poVar7,local_88,(void *)0x0);
            beltMACStart(si,poVar7,local_88);
            beltMACStepA(poVar7,local_88,si);
            beltMACStepG(si + -8,si);
          }
          local_58 = poVar7;
          eVar2 = belsShare2(si,local_70,uVar10,local_68,poVar7,rngStepR,(void *)0x0);
          if (eVar2 != 0) goto LAB_00105236;
          local_38 = si + local_40;
          poVar7 = si + local_40 + 8;
          rngRekey();
          local_50 = (char **)((long)local_50 + lVar11);
          local_88 = 0;
          goto LAB_00105272;
        }
        bVar1 = strStartsWith(*(char **)((long)argv + lVar11),"-t");
        pcVar8 = *(char **)((long)argv + lVar11);
        if (bVar1 != 0) {
          sVar5 = strLen("-t");
          if (local_70 != 0) {
LAB_00105129:
            eVar2 = 0x25c;
            pwd_00 = local_60;
            goto LAB_00105143;
          }
          pcVar8 = pcVar8 + sVar5;
          bVar1 = decIsValid(pcVar8);
          eVar2 = 0x25b;
          pwd_00 = local_60;
          if ((((bVar1 == 0) || (sVar5 = decCLZ(pcVar8), pwd_00 = local_60, sVar5 != 0)) ||
              (sVar5 = strLen(pcVar8), pwd_00 = local_60, 2 < sVar5)) ||
             (uVar4 = decToU32(pcVar8), pwd_00 = local_60, uVar4 - 0x11 < 0xfffffff1))
          goto LAB_00105143;
          local_70 = (ulong)uVar4;
LAB_00105062:
          argc = argc + -1;
          goto LAB_00104e37;
        }
        bVar1 = strStartsWith(pcVar8,"-l");
        pcVar8 = *(char **)((long)argv + lVar11);
        if (bVar1 != 0) {
          sVar5 = strLen("-l");
          if (local_78 != 0) goto LAB_00105129;
          pcVar8 = pcVar8 + sVar5;
          bVar1 = decIsValid(pcVar8);
          eVar2 = 0x25b;
          pwd_00 = local_60;
          if ((((bVar1 != 0) && (sVar5 = decCLZ(pcVar8), pwd_00 = local_60, sVar5 == 0)) &&
              ((sVar5 = strLen(pcVar8), pwd_00 = local_60, sVar5 == 3 &&
               ((uVar4 = decToU32(pcVar8), pwd_00 = local_60, 0xffffff7e < uVar4 - 0x101 &&
                ((uVar4 & 0x3f) == 0)))))) && (uVar4 != 0x80 || (int)local_88 == 0)) {
            local_78 = (size_t)(uVar4 >> 3);
            goto LAB_00105062;
          }
          goto LAB_00105143;
        }
        bVar1 = strStartsWith(pcVar8,"-crc");
        if (bVar1 != 0) goto LAB_00104f1c;
        iVar3 = strCmp(*(char **)((long)argv + lVar11),"-pass");
        if (iVar3 != 0) {
          eVar2 = 0x25b;
          pwd_00 = local_60;
          goto LAB_00105143;
        }
        if (local_60 != (octet *)0x0) goto LAB_00105129;
        argc = argc + -1;
        eVar2 = cmdPwdRead((cmd_pwd_t *)&local_60,*(char **)((long)argv + lVar11 + 8));
        if (eVar2 != 0) goto LAB_0010514b;
        argc = argc + -1;
        lVar11 = lVar11 + 0x10;
        lVar9 = lVar9 + 2;
      } while( true );
    }
    pcVar8 = "env:";
  }
  else {
    pcVar8 = "pass:";
  }
  strLen(pcVar8);
  return 0x77;
LAB_00105272:
  salt = local_38;
  sVar5 = local_78;
  if (local_70 == local_88) {
    dest = cmdPwdCreate(local_68 * 2);
    *pwd = dest;
    if (dest == (cmd_pwd_t)0x0) {
      eVar2 = 0x6e;
    }
    else {
      hexFrom(dest,local_58,local_68);
      eVar2 = 0;
    }
LAB_00105236:
    blobClose(local_58);
LAB_00105143:
    blobClose(pwd_00);
LAB_0010514b:
    cmdArgClose(argv);
    return eVar2;
  }
  rngStepR(local_38,8,(void *)0x0);
  sVar6 = strLen((char *)pwd_00);
  eVar2 = bpkiShareWrap(poVar7,(size_t *)0x0,si,sVar5,pwd_00,sVar6,salt,10000);
  uVar10 = local_88;
  if ((eVar2 != 0) || (eVar2 = cmdFileWrite(local_50[local_88],poVar7,local_48), eVar2 != 0))
  goto LAB_00105236;
  si = si + local_78;
  local_88 = uVar10 + 1;
  goto LAB_00105272;
LAB_00104f1c:
  eVar2 = ((int)local_88 != 0) + 0x25b;
  pwd_00 = local_60;
  if (((int)local_88 != 0) || (local_78 == 0x10)) goto LAB_00105143;
  argc = argc + -1;
  local_88 = CONCAT44(local_88._4_4_,1);
  goto LAB_00104e37;
}

Assistant:

err_t cmdPwdGen(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdGenPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdGenEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdGenShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}